

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O2

ssize_t SAFEREAD(int f,uchar *b,int c)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t extraout_RAX;
  
  do {
    sVar1 = read(f,b,6);
    if (-1 < sVar1) {
      return sVar1;
    }
    piVar2 = __errno_location();
  } while ((*piVar2 == 4) || (*piVar2 == 0xb));
  perror("reading UnixPipeIn");
  return extraout_RAX;
}

Assistant:

static inline ssize_t SAFEREAD(int f, unsigned char *b, int c) {
  ssize_t res;
  do {
    res = read(f, b, c);
    if (res >= 0) return (res);
  } while (errno == EINTR || errno == EAGAIN);
  perror("reading UnixPipeIn");
  return (res);
}